

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

int cmcmd_cmake_ninja_depends(const_iterator argBeg,const_iterator argEnd)

{
  _Head_base<0UL,_cmSourceInfo_*,_false> __p;
  bool bVar1;
  int iVar2;
  Value *pVVar3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  size_type sVar6;
  _Rb_tree_node_base *p_Var7;
  string *this;
  char *m1;
  uint uVar8;
  const_iterator cVar9;
  _Head_base<0UL,_cmSourceInfo_*,_false> local_648;
  unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_> info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string arg_pp;
  string local_5f8;
  string arg_lang;
  string arg_ddi;
  string arg_tdi;
  string arg_obj;
  string arg_dep;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_508;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d8;
  Value tdio;
  cmFortranCompiler fc;
  Value ddi;
  _Rb_tree_node_base local_3d8;
  _Map_pointer local_3b8;
  undefined1 local_3b0 [16];
  _Elt_pointer local_3a0;
  _Elt_pointer local_398;
  _Elt_pointer local_390;
  _Map_pointer local_388;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_380 [3];
  Value local_2f0;
  Value local_2c8;
  Value local_2a0;
  cmGeneratedFileStream ddif;
  
  arg_tdi._M_dataplus._M_p = (pointer)&arg_tdi.field_2;
  arg_tdi._M_string_length = 0;
  arg_pp._M_dataplus._M_p = (pointer)&arg_pp.field_2;
  arg_pp._M_string_length = 0;
  arg_tdi.field_2._M_local_buf[0] = '\0';
  arg_dep._M_dataplus._M_p = (pointer)&arg_dep.field_2;
  arg_dep._M_string_length = 0;
  arg_obj._M_dataplus._M_p = (pointer)&arg_obj.field_2;
  arg_obj._M_string_length = 0;
  arg_pp.field_2._M_local_buf[0] = '\0';
  arg_dep.field_2._M_local_buf[0] = '\0';
  arg_ddi._M_dataplus._M_p = (pointer)&arg_ddi.field_2;
  arg_ddi._M_string_length = 0;
  arg_lang._M_dataplus._M_p = (pointer)&arg_lang.field_2;
  arg_lang._M_string_length = 0;
  arg_obj.field_2._M_local_buf[0] = '\0';
  arg_ddi.field_2._M_local_buf[0] = '\0';
  arg_lang.field_2._M_local_buf[0] = '\0';
  uVar8 = 1;
  for (; argBeg._M_current != argEnd._M_current; argBeg._M_current = argBeg._M_current + 1) {
    bVar1 = cmHasLiteralPrefix<std::__cxx11::string,7ul>(argBeg._M_current,(char (*) [7])0x4785b1);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)&ddif,(ulong)argBeg._M_current);
      this = &arg_tdi;
    }
    else {
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,6ul>(argBeg._M_current,(char (*) [6])0x477c60)
      ;
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&ddif,(ulong)argBeg._M_current);
        this = &arg_pp;
      }
      else {
        bVar1 = cmHasLiteralPrefix<std::__cxx11::string,7ul>
                          (argBeg._M_current,(char (*) [7])0x477c90);
        if (bVar1) {
          std::__cxx11::string::substr((ulong)&ddif,(ulong)argBeg._M_current);
          this = &arg_dep;
        }
        else {
          bVar1 = cmHasLiteralPrefix<std::__cxx11::string,7ul>
                            (argBeg._M_current,(char (*) [7])0x477cc1);
          if (bVar1) {
            std::__cxx11::string::substr((ulong)&ddif,(ulong)argBeg._M_current);
            this = &arg_obj;
          }
          else {
            bVar1 = cmHasLiteralPrefix<std::__cxx11::string,7ul>
                              (argBeg._M_current,(char (*) [7])0x477cf2);
            if (bVar1) {
              std::__cxx11::string::substr((ulong)&ddif,(ulong)argBeg._M_current);
              this = &arg_ddi;
            }
            else {
              bVar1 = cmHasLiteralPrefix<std::__cxx11::string,8ul>
                                (argBeg._M_current,(char (*) [8])0x477e79);
              if (!bVar1) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ddif,"-E cmake_ninja_depends unknown argument: ",argBeg._M_current);
                cmSystemTools::Error((string *)&ddif);
                std::__cxx11::string::~string((string *)&ddif);
                goto LAB_0028f140;
              }
              std::__cxx11::string::substr((ulong)&ddif,(ulong)argBeg._M_current);
              this = &arg_lang;
            }
          }
        }
      }
    }
    std::__cxx11::string::operator=((string *)this,(string *)&ddif);
    std::__cxx11::string::~string((string *)&ddif);
  }
  if (arg_tdi._M_string_length == 0) {
    m1 = "-E cmake_ninja_depends requires value for --tdi=";
  }
  else if (arg_pp._M_string_length == 0) {
    m1 = "-E cmake_ninja_depends requires value for --pp=";
  }
  else if (arg_dep._M_string_length == 0) {
    m1 = "-E cmake_ninja_depends requires value for --dep=";
  }
  else if (arg_obj._M_string_length == 0) {
    m1 = "-E cmake_ninja_depends requires value for --obj=";
  }
  else if (arg_ddi._M_string_length == 0) {
    m1 = "-E cmake_ninja_depends requires value for --ddi=";
  }
  else {
    if (arg_lang._M_string_length != 0) {
      info._M_t.super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>._M_t.
      super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
      super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmSourceInfo,_std::default_delete<cmSourceInfo>,_true,_true>)
           (__uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>)0x0;
      bVar1 = std::operator==(&arg_lang,"Fortran");
      if (bVar1) {
        fc.Id._M_dataplus._M_p = (pointer)&fc.Id.field_2;
        fc.Id._M_string_length = 0;
        fc.Id.field_2._M_local_buf[0] = '\0';
        fc.SModSep._M_dataplus._M_p = (pointer)&fc.SModSep.field_2;
        fc.SModSep._M_string_length = 0;
        fc.SModSep.field_2._M_local_buf[0] = '\0';
        fc.SModExt._M_dataplus._M_p = (pointer)&fc.SModExt.field_2;
        fc.SModExt._M_string_length = 0;
        fc.SModExt.field_2._M_local_buf[0] = '\0';
        includes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        includes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        includes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Json::Value::Value(&tdio,nullValue);
        std::ifstream::ifstream(&ddif,arg_tdi._M_dataplus._M_p,_S_in|_S_bin);
        Json::Reader::Reader((Reader *)&ddi);
        bVar1 = Json::Reader::parse((Reader *)&ddi,(istream *)&ddif,&tdio,false);
        if (bVar1) {
          Json::Reader::~Reader((Reader *)&ddi);
          std::ifstream::~ifstream(&ddif);
          pVVar3 = Json::Value::operator[](&tdio,"include-dirs");
          bVar1 = Json::Value::isArray(pVVar3);
          if (bVar1) {
            cVar9 = Json::Value::begin(pVVar3);
            ddi.value_.int_ = (LargestInt)cVar9.super_ValueIteratorBase.current_._M_node;
            ddi._8_1_ = cVar9.super_ValueIteratorBase.isNull_;
            cVar9 = Json::Value::end(pVVar3);
            defines._M_t._M_impl._0_8_ = cVar9.super_ValueIteratorBase.current_._M_node;
            defines._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                 CONCAT31(defines._M_t._M_impl.super__Rb_tree_header._M_header._M_color._1_3_,
                          cVar9.super_ValueIteratorBase.isNull_);
            while (bVar1 = Json::ValueIteratorBase::operator!=
                                     ((ValueIteratorBase *)&ddi,(SelfType *)&defines), bVar1) {
              pVVar3 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&ddi);
              Json::Value::asString_abi_cxx11_((string *)&ddif,pVVar3);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &includes,(string *)&ddif);
              std::__cxx11::string::~string((string *)&ddif);
              Json::ValueIteratorBase::increment((ValueIteratorBase *)&ddi);
            }
          }
          pVVar3 = Json::Value::operator[](&tdio,"compiler-id");
          Json::Value::asString_abi_cxx11_((string *)&ddif,pVVar3);
          std::__cxx11::string::operator=((string *)&fc,(string *)&ddif);
          std::__cxx11::string::~string((string *)&ddif);
          pVVar3 = Json::Value::operator[](&tdio,"submodule-sep");
          Json::Value::asString_abi_cxx11_((string *)&ddif,pVVar3);
          std::__cxx11::string::operator=((string *)&fc.SModSep,(string *)&ddif);
          std::__cxx11::string::~string((string *)&ddif);
          pVVar3 = Json::Value::operator[](&tdio,"submodule-ext");
          Json::Value::asString_abi_cxx11_((string *)&ddif,pVVar3);
          std::__cxx11::string::operator=((string *)&fc.SModExt,(string *)&ddif);
          std::__cxx11::string::~string((string *)&ddif);
          Json::Value::~Value(&tdio);
          ddi.value_.string_ = (char *)&ddi.comments_;
          ddi._8_8_ = 0;
          ddi.comments_._0_1_ = 0;
          local_3d8._M_left = &local_3d8;
          local_3d8._M_color = _S_red;
          local_3d8._M_parent = (_Base_ptr)0x0;
          local_3b8 = (_Map_pointer)0x0;
          local_398 = (_Elt_pointer)(local_3b0 + 8);
          local_3b0._8_4_ = _S_red;
          local_3a0 = (_Elt_pointer)0x0;
          local_388 = (_Map_pointer)0x0;
          local_380[0]._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_380[0]._M_impl.super__Rb_tree_header._M_header;
          local_380[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_380[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_380[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
          defines._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &defines._M_t._M_impl.super__Rb_tree_header._M_header;
          defines._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          defines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          defines._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          defines._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               defines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_3d8._M_right = local_3d8._M_left;
          local_390 = local_398;
          local_380[0]._M_impl.super__Rb_tree_header._M_header._M_right =
               local_380[0]._M_impl.super__Rb_tree_header._M_header._M_left;
          cmFortranCompiler::cmFortranCompiler((cmFortranCompiler *)&tdio,&fc);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_4d8,&includes);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_Rb_tree(&local_508,&defines._M_t);
          cmFortranParser_s::cmFortranParser_s
                    ((cmFortranParser_s *)&ddif,(cmFortranCompiler *)&tdio,&local_4d8,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_508,(cmFortranSourceInfo *)&ddi);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_508);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_4d8);
          cmFortranCompiler::~cmFortranCompiler((cmFortranCompiler *)&tdio);
          bVar1 = cmFortranParser_FilePush((cmFortranParser *)&ddif,arg_pp._M_dataplus._M_p);
          if (bVar1) {
            iVar2 = cmFortran_yyparse((yyscan_t)
                                      ddif.super_ofstream.
                                      super_basic_ostream<char,_std::char_traits<char>_>._120_8_);
            if (iVar2 != 0) goto LAB_0028f565;
            std::make_unique<cmSourceInfo>();
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_648._M_head_impl,
                        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&ddi.limit_);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(&((local_648._M_head_impl)->Requires)._M_t,
                        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_3b0);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(&((local_648._M_head_impl)->Includes)._M_t,local_380);
          }
          else {
            std::operator+(&local_5f8,"-E cmake_ninja_depends failed to open ",&arg_pp);
            cmSystemTools::Error(&local_5f8);
            std::__cxx11::string::~string((string *)&local_5f8);
LAB_0028f565:
            local_648._M_head_impl = (pointer)0x0;
          }
          cmFortranParser_s::~cmFortranParser_s((cmFortranParser_s *)&ddif);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&defines._M_t);
          cmFortranSourceInfo::~cmFortranSourceInfo((cmFortranSourceInfo *)&ddi);
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_508,"-E cmake_ninja_depends failed to parse ",&arg_tdi);
          Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_5f8,(Reader *)&ddi);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &defines,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_508,&local_5f8);
          cmSystemTools::Error((string *)&defines);
          std::__cxx11::string::~string((string *)&defines);
          std::__cxx11::string::~string((string *)&local_5f8);
          std::__cxx11::string::~string((string *)&local_508);
          local_648._M_head_impl = (pointer)0x0;
          Json::Reader::~Reader((Reader *)&ddi);
          std::ifstream::~ifstream(&ddif);
          Json::Value::~Value(&tdio);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&includes);
        cmFortranCompiler::~cmFortranCompiler(&fc);
        __p._M_head_impl = local_648._M_head_impl;
        local_648._M_head_impl = (pointer)0x0;
        std::__uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>::reset
                  ((__uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_> *)&info,
                   __p._M_head_impl);
        std::unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_>::~unique_ptr
                  ((unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_> *)&local_648);
        if ((__uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>)
            info._M_t.super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>._M_t.
            super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
            super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>)0x0)
        goto LAB_0028f68b;
        cmGeneratedFileStream::cmGeneratedFileStream(&ddif,&arg_dep,false,None);
        cmsys::SystemTools::ConvertToUnixOutputPath((string *)&ddi,&arg_pp);
        poVar4 = std::operator<<((ostream *)&ddif,(string *)&ddi);
        std::operator<<(poVar4,":");
        std::__cxx11::string::~string((string *)&ddi);
        p_Var7 = (_Rb_tree_node_base *)
                 ((long)info._M_t.
                        super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>._M_t
                        .super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
                        super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl + 0x68);
        for (p_Var5 = *(_Rb_tree_node_base **)
                       ((long)info._M_t.
                              super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>
                              .super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl + 0x78);
            p_Var5 != p_Var7; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          poVar4 = std::operator<<((ostream *)&ddif," \\\n ");
          cmsys::SystemTools::ConvertToUnixOutputPath((string *)&ddi,(string *)(p_Var5 + 1));
          std::operator<<(poVar4,(string *)&ddi);
          std::__cxx11::string::~string((string *)&ddi);
        }
        std::operator<<((ostream *)&ddif,"\n");
        cmGeneratedFileStream::~cmGeneratedFileStream(&ddif);
        Json::Value::Value(&ddi,objectValue);
        Json::Value::Value(&local_2a0,&arg_obj);
        pVVar3 = Json::Value::operator[](&ddi,"object");
        Json::Value::operator=(pVVar3,&local_2a0);
        Json::Value::~Value(&local_2a0);
        Json::Value::Value(&local_2c8,arrayValue);
        pVVar3 = Json::Value::operator[](&ddi,"provides");
        pVVar3 = Json::Value::operator=(pVVar3,&local_2c8);
        Json::Value::~Value(&local_2c8);
        p_Var7 = (_Rb_tree_node_base *)
                 ((long)info._M_t.
                        super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>._M_t
                        .super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
                        super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl + 8);
        for (p_Var5 = *(_Rb_tree_node_base **)
                       ((long)info._M_t.
                              super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>
                              .super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl + 0x18);
            p_Var5 != p_Var7; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          Json::Value::Value((Value *)&ddif,(string *)(p_Var5 + 1));
          Json::Value::append(pVVar3,(Value *)&ddif);
          Json::Value::~Value((Value *)&ddif);
        }
        Json::Value::Value(&local_2f0,arrayValue);
        pVVar3 = Json::Value::operator[](&ddi,"requires");
        pVVar3 = Json::Value::operator=(pVVar3,&local_2f0);
        Json::Value::~Value(&local_2f0);
        p_Var7 = (_Rb_tree_node_base *)
                 ((long)info._M_t.
                        super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>._M_t
                        .super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
                        super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl + 0x38);
        for (p_Var5 = *(_Rb_tree_node_base **)
                       ((long)info._M_t.
                              super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>
                              .super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl + 0x48);
            p_Var5 != p_Var7; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          sVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)info._M_t.
                             super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>
                             .super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl,
                          (key_type *)(p_Var5 + 1));
          if (sVar6 == 0) {
            Json::Value::Value((Value *)&ddif,(string *)(p_Var5 + 1));
            Json::Value::append(pVVar3,(Value *)&ddif);
            Json::Value::~Value((Value *)&ddif);
          }
        }
        cmGeneratedFileStream::cmGeneratedFileStream(&ddif,&arg_ddi,false,None);
        Json::operator<<((ostream *)&ddif,&ddi);
        bVar1 = ((&ddif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20
                 )[(long)ddif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3]] & 5) != 0;
        if (bVar1) {
          std::operator+(&fc.Id,"-E cmake_ninja_depends failed to write ",&arg_ddi);
          cmSystemTools::Error(&fc.Id);
          std::__cxx11::string::~string((string *)&fc);
        }
        uVar8 = (uint)bVar1;
        cmGeneratedFileStream::~cmGeneratedFileStream(&ddif);
        Json::Value::~Value(&ddi);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ddi,
                       "-E cmake_ninja_depends does not understand the ",&arg_lang);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ddif,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ddi,
                       " language");
        cmSystemTools::Error((string *)&ddif);
        std::__cxx11::string::~string((string *)&ddif);
        std::__cxx11::string::~string((string *)&ddi);
LAB_0028f68b:
        uVar8 = 1;
      }
      std::unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_>::~unique_ptr(&info);
      goto LAB_0028f140;
    }
    m1 = "-E cmake_ninja_depends requires value for --lang=";
  }
  cmSystemTools::Error(m1,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_0028f140:
  std::__cxx11::string::~string((string *)&arg_lang);
  std::__cxx11::string::~string((string *)&arg_ddi);
  std::__cxx11::string::~string((string *)&arg_obj);
  std::__cxx11::string::~string((string *)&arg_dep);
  std::__cxx11::string::~string((string *)&arg_pp);
  std::__cxx11::string::~string((string *)&arg_tdi);
  return uVar8;
}

Assistant:

int cmcmd_cmake_ninja_depends(std::vector<std::string>::const_iterator argBeg,
                              std::vector<std::string>::const_iterator argEnd)
{
  std::string arg_tdi;
  std::string arg_pp;
  std::string arg_dep;
  std::string arg_obj;
  std::string arg_ddi;
  std::string arg_lang;
  for (std::string const& arg : cmMakeRange(argBeg, argEnd)) {
    if (cmHasLiteralPrefix(arg, "--tdi=")) {
      arg_tdi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--pp=")) {
      arg_pp = arg.substr(5);
    } else if (cmHasLiteralPrefix(arg, "--dep=")) {
      arg_dep = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--obj=")) {
      arg_obj = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--ddi=")) {
      arg_ddi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--lang=")) {
      arg_lang = arg.substr(7);
    } else {
      cmSystemTools::Error("-E cmake_ninja_depends unknown argument: " + arg);
      return 1;
    }
  }
  if (arg_tdi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --tdi=");
    return 1;
  }
  if (arg_pp.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --pp=");
    return 1;
  }
  if (arg_dep.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --dep=");
    return 1;
  }
  if (arg_obj.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --obj=");
    return 1;
  }
  if (arg_ddi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --ddi=");
    return 1;
  }
  if (arg_lang.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --lang=");
    return 1;
  }

  std::unique_ptr<cmSourceInfo> info;
  if (arg_lang == "Fortran") {
    info = cmcmd_cmake_ninja_depends_fortran(arg_tdi, arg_pp);
  } else {
    cmSystemTools::Error("-E cmake_ninja_depends does not understand the " +
                         arg_lang + " language");
    return 1;
  }

  if (!info) {
    // The error message is already expected to have been output.
    return 1;
  }

  {
    cmGeneratedFileStream depfile(arg_dep);
    depfile << cmSystemTools::ConvertToUnixOutputPath(arg_pp) << ":";
    for (std::string const& include : info->Includes) {
      depfile << " \\\n " << cmSystemTools::ConvertToUnixOutputPath(include);
    }
    depfile << "\n";
  }

  Json::Value ddi(Json::objectValue);
  ddi["object"] = arg_obj;

  Json::Value& ddi_provides = ddi["provides"] = Json::arrayValue;
  for (std::string const& provide : info->Provides) {
    ddi_provides.append(provide);
  }
  Json::Value& ddi_requires = ddi["requires"] = Json::arrayValue;
  for (std::string const& r : info->Requires) {
    // Require modules not provided in the same source.
    if (!info->Provides.count(r)) {
      ddi_requires.append(r);
    }
  }

  cmGeneratedFileStream ddif(arg_ddi);
  ddif << ddi;
  if (!ddif) {
    cmSystemTools::Error("-E cmake_ninja_depends failed to write " + arg_ddi);
    return 1;
  }
  return 0;
}